

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O0

int EVP_PKEY_cmp(EVP_PKEY *a,EVP_PKEY *b)

{
  int iVar1;
  int ret;
  EVP_PKEY *b_local;
  EVP_PKEY *a_local;
  
  if (a->save_type != b->save_type) {
    return -1;
  }
  if (a->ameth != (EVP_PKEY_ASN1_METHOD *)0x0) {
    if ((*(long *)(a->ameth + 0x98) != 0) &&
       (iVar1 = (**(code **)(a->ameth + 0x98))(a,b), iVar1 < 1)) {
      return iVar1;
    }
    if (*(long *)(a->ameth + 0x28) != 0) {
      iVar1 = (**(code **)(a->ameth + 0x28))(a,b);
      return iVar1;
    }
  }
  return -2;
}

Assistant:

int EVP_PKEY_cmp(const EVP_PKEY *a, const EVP_PKEY *b) {
  if (a->type != b->type) {
    return -1;
  }

  if (a->ameth) {
    int ret;
    // Compare parameters if the algorithm has them
    if (a->ameth->param_cmp) {
      ret = a->ameth->param_cmp(a, b);
      if (ret <= 0) {
        return ret;
      }
    }

    if (a->ameth->pub_cmp) {
      return a->ameth->pub_cmp(a, b);
    }
  }

  return -2;
}